

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_gga_inc.c
# Opt level: O1

void work_gga_fxc_unpol(xc_func_type *p,size_t np,double *rho,double *sigma,xc_gga_out_params *out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double *pdVar9;
  bool bVar10;
  bool bVar11;
  long lVar12;
  size_t sVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double __x;
  double dVar37;
  double dVar38;
  double dVar39;
  double __x_00;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double __x_01;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double __x_02;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  undefined1 auVar117 [16];
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  undefined1 auVar151 [16];
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  undefined1 auVar170 [16];
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar177;
  double dVar178;
  double dVar179;
  double dVar180;
  double dVar181;
  undefined1 auVar182 [16];
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  undefined1 auVar189 [16];
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  undefined1 auVar198 [16];
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double local_b30;
  double local_8f0;
  undefined1 local_828 [320];
  double local_6e8;
  double local_a8;
  double dStack_a0;
  
  if (np != 0) {
    sVar13 = 0;
    do {
      if (p->nspin == 2) {
        lVar12 = (long)(p->dim).rho * sVar13;
        dVar66 = rho[lVar12] + rho[lVar12 + 1];
      }
      else {
        dVar66 = rho[(long)(p->dim).rho * sVar13];
      }
      dVar62 = p->dens_threshold;
      if (dVar62 <= dVar66) {
        dVar66 = rho[(long)(p->dim).rho * sVar13];
        if (rho[(long)(p->dim).rho * sVar13] <= dVar62) {
          dVar66 = dVar62;
        }
        dVar120 = p->sigma_threshold * p->sigma_threshold;
        dVar1 = sigma[(long)(p->dim).sigma * sVar13];
        pdVar9 = (double *)p->params;
        dVar181 = p->zeta_threshold;
        bVar10 = dVar181 < 1.0;
        bVar11 = dVar62 < dVar66 * 0.5;
        dVar15 = cbrt(0.3183098861837907);
        dVar16 = dVar15 * 1.4422495703074083;
        dVar17 = dVar16 * 2.519842099789747;
        dVar18 = cbrt(dVar181);
        dVar102 = dVar181 * dVar18;
        dVar62 = dVar102;
        if (dVar181 < 2.0) {
          dVar62 = 2.5198420997897464;
        }
        if (dVar1 <= dVar120) {
          dVar1 = dVar120;
        }
        dVar67 = dVar17 * 1.2599210498948732;
        dVar19 = cbrt(dVar66);
        dVar120 = cbrt(9.0);
        dVar20 = dVar15 * dVar15;
        dVar121 = dVar120 * dVar120 * dVar20 * p->cam_omega;
        dVar103 = 1.0 / dVar19;
        dVar120 = (double)(~-(ulong)(2.0 <= dVar181) & 0x3ff0000000000000 |
                          (ulong)(1.2599210498948732 / dVar18) & -(ulong)(2.0 <= dVar181));
        dVar122 = dVar121 * 1.4422495703074083;
        dVar104 = (dVar103 * dVar122 * dVar120) / 18.0;
        dVar61 = 1.35;
        if (dVar104 <= 1.35) {
          dVar61 = dVar104;
        }
        dVar21 = 1.0 / dVar61;
        dVar22 = erf(dVar21 * 0.5);
        dVar68 = dVar61 * dVar61;
        dVar23 = 1.0 / dVar68;
        dVar24 = exp(dVar23 * -0.25);
        dVar87 = dVar104;
        if (dVar104 <= 1.35) {
          dVar87 = 1.35;
        }
        dVar123 = dVar87 * dVar87;
        dVar212 = dVar123 * dVar123;
        dVar199 = 1.0 / (dVar123 * dVar212);
        dVar69 = dVar212 * dVar212;
        auVar182._0_8_ = dVar69 * dVar69;
        auVar182._8_8_ = dVar69;
        auVar182 = divpd(_DAT_00f6f930,auVar182);
        dVar211 = auVar182._0_8_;
        local_828._8_8_ = auVar182._8_8_;
        auVar198._8_8_ = dVar212;
        auVar198._0_8_ = dVar123;
        auVar63._8_8_ = local_828._8_8_;
        auVar63._0_8_ = local_828._8_8_;
        auVar198 = divpd(auVar63,auVar198);
        local_828._0_8_ = local_828._8_8_;
        dVar183 = (double)local_828._8_8_ / (dVar123 * dVar212);
        dVar105 = dVar24 + -1.0;
        dVar70 = dVar68 * -2.0 * dVar105 + dVar24 + -1.5;
        dVar69 = dVar61 + dVar61;
        dVar22 = dVar69 * dVar70 + dVar22 * 1.7724538509055159;
        if (dVar104 < 1.35) {
          dVar163 = dVar61 * -2.6666666666666665 * dVar22 + 1.0;
        }
        else {
          auVar170._0_8_ = 1.0 / dVar123;
          auVar170._8_8_ = 1.0 / dVar212;
          auVar170 = divpd(auVar170,_DAT_00f7bb30);
          auVar98._8_8_ = local_828._8_8_;
          auVar98._0_8_ = dVar199;
          auVar63 = divpd(auVar98,_DAT_00f7bb40);
          auVar98 = divpd(auVar198,_DAT_00f7bb50);
          auVar117._8_8_ = dVar211;
          auVar117._0_8_ = dVar183;
          auVar117 = divpd(auVar117,_DAT_00f7bb60);
          dVar163 = ((((((auVar170._0_8_ - auVar170._8_8_) + auVar63._0_8_) - auVar63._8_8_) +
                      auVar98._0_8_) - auVar98._8_8_) + auVar117._0_8_) - auVar117._8_8_;
        }
        dVar2 = pdVar9[1];
        dVar3 = pdVar9[2];
        dVar152 = dVar1 * dVar2;
        dVar124 = dVar66 * dVar66;
        dVar213 = 1.0 / (dVar19 * dVar19);
        dVar25 = dVar213 / dVar124;
        dVar223 = dVar25 * 1.5874010519681996;
        dVar71 = dVar1 * 1.5874010519681996 * dVar25;
        dVar26 = dVar71 * 0.004 + 1.0;
        dVar204 = 1.0 / dVar26;
        dVar171 = dVar1 * dVar1;
        dVar200 = dVar171 * dVar3;
        dVar184 = dVar26 * dVar26;
        dVar233 = 1.0 / (dVar26 * dVar184);
        dVar229 = 1.0 / (dVar184 * dVar184);
        dVar190 = dVar124 * dVar124;
        dVar72 = dVar103 / (dVar66 * dVar190);
        dVar73 = dVar72 * 1.2599210498948732;
        dVar27 = 1.0 / dVar184;
        dVar185 = dVar73 * dVar27;
        dVar201 = dVar1 * dVar171;
        dVar4 = pdVar9[3];
        dVar153 = dVar201 * dVar4;
        dVar191 = dVar190 * dVar190;
        dVar28 = 1.0 / dVar191;
        dVar186 = dVar28 * dVar233;
        dVar154 = dVar171 * dVar171;
        dVar5 = pdVar9[4];
        dVar155 = dVar154 * dVar5;
        dVar74 = (dVar213 / (dVar124 * dVar191)) * 1.5874010519681996;
        dVar75 = dVar74 * dVar229;
        dVar156 = dVar155 * 1.024e-09 * dVar75 +
                  dVar153 * 2.56e-07 * dVar186 +
                  dVar200 * 3.2e-05 * dVar185 + dVar152 * 0.004 * dVar223 * dVar204 + *pdVar9;
        dVar29 = dVar163 * dVar156;
        dVar30 = dVar67 * -0.046875 * dVar19 * dVar62;
        dVar31 = 0.0;
        if (bVar11 && bVar10) {
          dVar31 = dVar30 * dVar29 + dVar30 * dVar29;
        }
        dVar32 = 1.0;
        if (1.0 <= dVar181) {
          dVar32 = p->zeta_threshold;
        }
        uVar14 = -(ulong)(1.0 <= dVar181);
        dVar181 = (double)((ulong)(1.0 / dVar18) & uVar14 | ~uVar14 & 0x3ff0000000000000);
        dVar157 = dVar17 * dVar103;
        dVar158 = dVar157 * 1.2599210498948732 * dVar181;
        dVar76 = SQRT(dVar158);
        dVar18 = dVar76;
        if (dVar158 < 0.0) {
          dVar18 = sqrt(dVar158);
          dVar76 = sqrt(dVar158);
        }
        dVar33 = dVar158 * 0.053425 + 1.0;
        dVar76 = dVar76 * dVar158;
        dVar34 = dVar20 * 2.080083823051904 * 1.5874010519681996;
        dVar77 = dVar181 * dVar181;
        dVar35 = dVar34 * dVar213;
        dVar36 = dVar35 * 1.5874010519681996 * dVar77;
        dVar78 = dVar36 * 0.123235 + dVar76 * 0.204775 + dVar18 * 3.79785 + dVar158 * 0.8969;
        __x = 16.081824322151103 / dVar78 + 1.0;
        dVar37 = log(__x);
        local_6e8 = 0.0;
        dVar38 = ((double)(-(ulong)(0.0 <= p->zeta_threshold) & (ulong)dVar102) + dVar62 + -2.0) *
                 1.9236610509315362;
        dVar39 = dVar158 * 0.05137 + 1.0;
        dVar79 = dVar36 * 0.1562925 + dVar76 * 0.420775 + dVar18 * 7.05945 + dVar158 * 1.549425;
        __x_00 = 32.1646831778707 / dVar79 + 1.0;
        dVar40 = log(__x_00);
        dVar41 = dVar158 * 0.0278125 + 1.0;
        dVar80 = dVar36 * 0.1241775 + dVar76 * 0.1100325 + dVar18 * 5.1785 + dVar158 * 0.905775;
        dVar76 = 29.608574643216677 / dVar80 + 1.0;
        dVar36 = log(dVar76);
        if (bVar11 && bVar10) {
          dVar81 = dVar33 * 0.062182 * dVar37;
          local_6e8 = (dVar38 * 0.019751789702565206 * dVar41 * dVar36 +
                      ((dVar41 * dVar36 * -0.019751789702565206 +
                       dVar39 * -0.03109 * dVar40 + dVar81) * dVar38 - dVar81)) * dVar32 * 0.5;
        }
        dVar81 = pdVar9[6];
        dVar6 = pdVar9[7];
        dVar164 = dVar1 * dVar81;
        dVar187 = dVar71 * 0.2 + 1.0;
        dVar172 = 1.0 / dVar187;
        dVar159 = dVar171 * dVar6;
        dVar7 = pdVar9[8];
        dVar145 = dVar201 * dVar7;
        dVar8 = pdVar9[9];
        dVar82 = dVar154 * dVar8;
        dVar44 = pdVar9[5];
        dVar192 = SQRT(dVar157);
        local_b30 = dVar192;
        if (dVar157 < 0.0) {
          local_b30 = sqrt(dVar157);
        }
        dVar83 = dVar187 * dVar187;
        dVar42 = 1.0 / dVar83;
        dVar173 = dVar73 * dVar42;
        dVar160 = 1.0 / (dVar187 * dVar83);
        dVar165 = 1.0 / (dVar83 * dVar83);
        dVar84 = dVar28 * dVar160;
        dVar43 = dVar74 * dVar165;
        dVar125 = dVar82 * 0.0064 * dVar43 +
                  dVar145 * 0.032 * dVar84 +
                  dVar159 * 0.08 * dVar173 + dVar164 * 0.2 * dVar223 * dVar172 + dVar44;
        dVar44 = local_6e8 + local_6e8;
        dVar45 = dVar157 * 0.053425 + 1.0;
        if (dVar157 < 0.0) {
          dVar192 = sqrt(dVar157);
        }
        dVar85 = dVar35 * 0.123235 +
                 dVar192 * dVar157 * 0.204775 + local_b30 * 3.79785 + dVar157 * 0.8969;
        __x_01 = 16.081824322151103 / dVar85 + 1.0;
        dVar46 = log(__x_01);
        dVar102 = (double)(~uVar14 & 0x3ff0000000000000 | uVar14 & (ulong)dVar102);
        dVar106 = (dVar102 + dVar102 + -2.0) * 1.9236610509315362;
        dVar126 = dVar157 * 0.0278125 + 1.0;
        dVar107 = dVar35 * 0.1241775 +
                  dVar192 * dVar157 * 0.1100325 + local_b30 * 5.1785 + dVar157 * 0.905775;
        __x_02 = 29.608574643216677 / dVar107 + 1.0;
        dVar47 = log(__x_02);
        dVar102 = pdVar9[0xb];
        dVar35 = pdVar9[0xc];
        dVar188 = dVar1 * dVar102;
        dVar127 = dVar71 * 0.006 + 1.0;
        dVar214 = 1.0 / dVar127;
        dVar166 = dVar171 * dVar35;
        dVar174 = dVar127 * dVar127;
        dVar48 = 1.0 / dVar174;
        dVar73 = dVar73 * dVar48;
        dVar71 = pdVar9[0xd];
        dVar161 = dVar201 * dVar71;
        dVar86 = 1.0 / (dVar127 * dVar174);
        dVar28 = dVar28 * dVar86;
        dVar193 = 1.0 / (dVar174 * dVar174);
        dVar192 = pdVar9[0xe];
        dVar108 = dVar154 * dVar192;
        dVar74 = dVar74 * dVar193;
        dVar109 = dVar108 * 5.184e-09 * dVar74 +
                  dVar161 * 8.64e-07 * dVar28 +
                  dVar166 * 7.2e-05 * dVar73 + dVar188 * 0.006 * dVar223 * dVar214 + pdVar9[10];
        dVar146 = (dVar45 * -0.062182 * dVar46 + dVar106 * 0.019751789702565206 * dVar126 * dVar47)
                  - dVar44;
        dVar31 = dVar31 + dVar44 * dVar125 + dVar146 * dVar109;
        pdVar9 = out->zk;
        if ((pdVar9 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          lVar12 = (long)(p->dim).zk * sVar13;
          pdVar9[lVar12] = pdVar9[lVar12] + dVar31;
        }
        auVar64._0_8_ = dVar212 * dVar87;
        auVar64._8_8_ = dVar123 * dVar87;
        dVar110 = dVar103 / dVar66;
        dVar175 = (dVar122 * dVar110 * dVar120) / -54.0;
        dVar122 = dVar175;
        if (dVar104 <= 1.35) {
          dVar122 = 0.0;
        }
        auVar189._8_8_ = 0x3ff0000000000000;
        auVar189._0_8_ = local_828._8_8_;
        auVar119._8_8_ = dVar212 * auVar64._8_8_;
        auVar119._0_8_ = dVar87;
        auVar98 = divpd(auVar189,auVar119);
        auVar63 = divpd(local_828._0_16_,auVar64);
        auVar141._8_8_ = dVar212 * auVar64._8_8_;
        auVar141._0_8_ = dVar87;
        auVar182 = divpd(auVar182,auVar141);
        uVar14 = -(ulong)(1.35 < dVar104);
        dVar175 = (double)(~uVar14 & (ulong)dVar175);
        dVar87 = 1.0 / (dVar61 * dVar68);
        dVar128 = dVar105 * dVar61 * -4.0;
        dVar129 = (dVar128 * dVar175 + dVar175 * dVar87 * dVar24 * 0.5) - dVar175 * dVar21 * dVar24;
        dVar176 = dVar69 * dVar129 + (dVar175 + dVar175) * dVar70 + -dVar24 * dVar23 * dVar175;
        if (dVar104 < 1.35) {
          dVar49 = dVar61 * -2.6666666666666665 * dVar176;
          dVar224 = dVar175 * -2.6666666666666665 * dVar22;
        }
        else {
          auVar99._0_8_ = -(1.0 / auVar64._8_8_) * dVar122;
          auVar99._8_8_ = (1.0 / auVar64._0_8_) * dVar122;
          auVar170 = divpd(auVar99,_DAT_00f7bb70);
          auVar118._0_8_ = dVar122 * auVar98._0_8_;
          auVar118._8_8_ = dVar122 * auVar98._8_8_;
          auVar119 = divpd(auVar118,_DAT_00f7bb80);
          auVar140._0_8_ = dVar122 * auVar63._0_8_;
          auVar140._8_8_ = dVar122 * auVar63._8_8_;
          auVar141 = divpd(auVar140,_DAT_00f7bb90);
          auVar65._0_8_ = dVar122 * auVar182._0_8_;
          auVar65._8_8_ = dVar122 * auVar182._8_8_;
          auVar117 = divpd(auVar65,_DAT_00f7bba0);
          dVar49 = auVar117._0_8_;
          dVar224 = (((((auVar170._8_8_ + auVar170._0_8_) - auVar119._8_8_) + auVar119._0_8_) -
                     auVar141._8_8_) + auVar141._0_8_) - auVar117._8_8_;
        }
        dVar224 = dVar224 + dVar49;
        dVar147 = dVar66 * dVar124;
        dVar202 = dVar213 / dVar147;
        dVar203 = dVar202 * 1.5874010519681996;
        dVar234 = dVar171 * dVar2;
        dVar177 = dVar103 / (dVar124 * dVar190);
        dVar178 = dVar177 * 1.2599210498948732;
        dVar179 = dVar178 * dVar27;
        dVar230 = dVar201 * dVar3;
        dVar130 = 1.0 / (dVar66 * dVar191);
        dVar131 = dVar130 * dVar233;
        dVar194 = dVar213 / (dVar147 * dVar191);
        dVar215 = (1.2599210498948732 / dVar19) / (dVar124 * dVar190 * dVar191);
        dVar26 = dVar229 / dVar26;
        dVar49 = dVar154 * dVar4;
        dVar195 = dVar194 * dVar229 * 1.5874010519681996;
        dVar50 = dVar1 * dVar154;
        dVar51 = dVar50 * dVar5;
        dVar216 = dVar215 * dVar26;
        dVar111 = dVar51 * 8.738133333333333e-11 * dVar216 +
                  dVar155 * -1.0922666666666667e-08 * dVar195 +
                  dVar49 * 8.192e-09 * dVar195 +
                  dVar153 * -2.048e-06 * dVar131 +
                  dVar230 * 1.3653333333333333e-06 * dVar131 +
                  dVar200 * -0.00017066666666666668 * dVar179 +
                  dVar152 * -0.010666666666666666 * dVar203 * dVar204 +
                  dVar234 * 8.533333333333334e-05 * dVar179;
        dVar52 = dVar62 * dVar213;
        dVar132 = dVar163 * dVar111;
        dVar112 = 0.0;
        if (bVar11 && bVar10) {
          dVar112 = dVar30 * dVar132 +
                    dVar30 * dVar156 * dVar224 + dVar52 * dVar67 * dVar29 * -0.015625;
        }
        dVar167 = dVar110 * 1.2599210498948732;
        dVar88 = dVar78 * dVar78;
        dVar133 = (1.0 / dVar18) * 1.4422495703074083 * dVar15;
        dVar89 = dVar110 * 2.519842099789747;
        dVar113 = dVar181 * 1.2599210498948732;
        dVar217 = dVar113 * dVar89 * dVar133;
        dVar235 = dVar17 * dVar181 * dVar167;
        if (dVar158 < 0.0) {
          dVar134 = sqrt(dVar158);
        }
        else {
          dVar134 = SQRT(dVar158);
        }
        dVar53 = dVar33 * (1.0 / dVar88);
        dVar135 = dVar134 * 1.4422495703074083 * dVar15;
        dVar205 = dVar113 * dVar89 * dVar135;
        dVar225 = dVar34 * (dVar213 / dVar66);
        dVar196 = dVar225 * 1.5874010519681996 * dVar77;
        dVar90 = dVar196 * -0.08215666666666667 +
                 dVar205 * -0.1023875 + dVar217 * -0.632975 + dVar235 * -0.29896666666666666;
        dVar134 = 1.0 / __x;
        dVar54 = dVar79 * dVar79;
        dVar55 = dVar39 * (1.0 / dVar54);
        dVar91 = dVar196 * -0.104195 +
                 dVar205 * -0.2103875 + dVar217 * -1.176575 + dVar235 * -0.516475;
        dVar56 = 1.0 / __x_00;
        dVar57 = dVar80 * dVar80;
        dVar114 = 1.0 / dVar57;
        dVar235 = dVar196 * -0.082785 +
                  dVar205 * -0.05501625 + dVar217 * -0.8630833333333333 + dVar235 * -0.301925;
        dVar217 = 1.0 / dVar76;
        dVar196 = dVar41 * dVar38;
        dVar205 = dVar114 * dVar235 * dVar217;
        local_8f0 = 0.0;
        if (bVar11 && bVar10) {
          dVar92 = dVar134 * dVar90 * dVar53;
          dVar58 = dVar17 * 0.0011073577833333333 * dVar167 * dVar37 * dVar181;
          local_8f0 = (dVar196 * -0.5848223397455204 * dVar205 +
                      dVar16 * dVar38 * -0.0001831155503675316 * dVar89 * dVar36 * dVar113 +
                      (dVar41 * dVar114 * 0.5848223397455204 * dVar217 * dVar235 +
                      dVar17 * 0.0001831155503675316 * dVar167 * dVar181 * dVar36 +
                      (((dVar17 * 0.0005323644333333333 * dVar167 * dVar40 * dVar181 +
                        dVar56 * dVar91 * dVar55) - dVar58) - dVar92)) * dVar38 + dVar58 + dVar92) *
                      dVar32 * 0.5;
        }
        dVar92 = dVar171 * dVar81;
        dVar236 = dVar178 * dVar42;
        dVar206 = dVar201 * dVar6;
        dVar218 = dVar130 * dVar160;
        dVar115 = dVar154 * dVar7;
        dVar180 = dVar194 * dVar165 * 1.5874010519681996;
        dVar136 = dVar50 * dVar8;
        dVar187 = dVar165 / dVar187;
        dVar197 = dVar215 * dVar187;
        dVar137 = dVar136 * 0.027306666666666667 * dVar197 +
                  dVar82 * -0.06826666666666667 * dVar180 +
                  dVar115 * 0.0512 * dVar180 +
                  dVar145 * -0.256 * dVar218 +
                  dVar206 * 0.17066666666666666 * dVar218 +
                  dVar159 * -0.4266666666666667 * dVar236 +
                  dVar164 * -0.5333333333333333 * dVar203 * dVar172 +
                  dVar92 * 0.21333333333333335 * dVar236;
        dVar93 = dVar85 * dVar85;
        dVar207 = dVar45 * (1.0 / dVar93);
        dVar94 = (1.0 / local_b30) * 1.4422495703074083;
        dVar15 = dVar15 * 2.519842099789747;
        dVar138 = dVar15 * dVar110 * dVar94;
        dVar58 = dVar16 * dVar89;
        if (dVar157 < 0.0) {
          dVar95 = sqrt(dVar157);
        }
        else {
          dVar95 = SQRT(dVar157);
        }
        dVar219 = dVar15 * dVar110 * dVar95 * 1.4422495703074083;
        dVar96 = dVar225 * -0.08215666666666667 +
                 dVar219 * -0.1023875 + dVar138 * -0.632975 + dVar58 * -0.29896666666666666;
        dVar237 = 1.0 / __x_01;
        dVar126 = dVar126 * dVar106;
        dVar59 = dVar107 * dVar107;
        dVar226 = dVar225 * -0.082785 +
                  dVar219 * -0.05501625 + dVar138 * -0.8630833333333333 + dVar58 * -0.301925;
        dVar225 = 1.0 / __x_02;
        dVar231 = (1.0 / dVar59) * dVar226 * dVar225;
        dVar227 = (dVar126 * -0.5848223397455204 * dVar231 +
                  dVar106 * 1.4422495703074083 * -0.0001831155503675316 * dVar15 * dVar110 * dVar47
                  + dVar16 * 0.0011073577833333333 * dVar89 * dVar46 + dVar207 * dVar237 * dVar96) -
                  (local_8f0 + local_8f0);
        dVar238 = dVar171 * dVar102;
        dVar178 = dVar178 * dVar48;
        dVar220 = dVar201 * dVar35;
        dVar130 = dVar130 * dVar86;
        dVar208 = dVar154 * dVar71;
        dVar168 = dVar194 * dVar193 * 1.5874010519681996;
        dVar127 = dVar193 / dVar127;
        dVar138 = dVar50 * dVar192;
        dVar215 = dVar215 * dVar127;
        dVar194 = dVar138 * 6.63552e-10 * dVar215 +
                  dVar108 * -5.5296e-08 * dVar168 +
                  dVar208 * 4.1472e-08 * dVar168 +
                  dVar161 * -6.912e-06 * dVar130 +
                  dVar220 * 4.608e-06 * dVar130 +
                  dVar166 * -0.000384 * dVar178 +
                  dVar203 * dVar188 * -0.016 * dVar214 + dVar238 * 0.000192 * dVar178;
        dVar221 = dVar125 * local_8f0;
        dVar209 = local_6e8 * dVar137;
        dVar219 = dVar109 * dVar227;
        dVar203 = dVar146 * dVar194;
        pdVar9 = out->vrho;
        if ((pdVar9 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar12 = (long)(p->dim).vrho * sVar13;
          pdVar9[lVar12] =
               (dVar209 + dVar209 + dVar112 + dVar112 + dVar221 + dVar221 + dVar219 + dVar203) *
               dVar66 + dVar31 + pdVar9[lVar12];
        }
        dVar116 = dVar1 * dVar3;
        dVar169 = dVar171 * dVar4;
        dVar139 = dVar201 * dVar5;
        dVar228 = (1.2599210498948732 / dVar19) / (dVar66 * dVar190 * dVar191);
        dVar148 = dVar228 * dVar26;
        dVar31 = dVar155 * -3.2768e-11 * dVar148 +
                 dVar139 * 4.096e-09 * dVar75 +
                 dVar153 * -3.072e-09 * dVar75 +
                 dVar169 * 7.68e-07 * dVar186 +
                 dVar200 * -5.12e-07 * dVar186 +
                 dVar116 * 6.4e-05 * dVar185 +
                 dVar2 * 1.5874010519681996 * 0.004 * dVar25 * dVar204 +
                 dVar152 * -3.2e-05 * dVar185;
        dVar97 = dVar163 * dVar31;
        dVar185 = 0.0;
        if (bVar11 && bVar10) {
          dVar185 = dVar30 * dVar97;
          dVar185 = dVar185 + dVar185;
        }
        dVar149 = dVar1 * dVar6;
        dVar239 = dVar171 * dVar7;
        dVar162 = dVar201 * dVar8;
        dVar222 = dVar228 * dVar187;
        dVar150 = dVar82 * -0.01024 * dVar222 +
                  dVar162 * 0.0256 * dVar43 +
                  dVar145 * -0.0192 * dVar43 +
                  dVar239 * 0.096 * dVar84 +
                  dVar159 * -0.064 * dVar84 +
                  dVar149 * 0.16 * dVar173 +
                  dVar81 * 1.5874010519681996 * 0.2 * dVar25 * dVar172 + dVar164 * -0.08 * dVar173;
        dVar173 = dVar1 * dVar35;
        dVar232 = dVar171 * dVar71;
        dVar210 = dVar201 * dVar192;
        dVar228 = dVar228 * dVar127;
        dVar73 = dVar108 * -2.48832e-10 * dVar228 +
                 dVar210 * 2.0736e-08 * dVar74 +
                 dVar161 * -1.5552e-08 * dVar74 +
                 dVar232 * 2.592e-06 * dVar28 +
                 dVar166 * -1.728e-06 * dVar28 +
                 dVar173 * 0.000144 * dVar73 +
                 dVar102 * 1.5874010519681996 * 0.006 * dVar25 * dVar214 +
                 dVar188 * -7.2e-05 * dVar73;
        dVar185 = dVar146 * dVar73 + dVar44 * dVar150 + dVar185;
        pdVar9 = out->vsigma;
        if ((pdVar9 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar12 = (long)(p->dim).vsigma * sVar13;
          pdVar9[lVar12] = dVar66 * dVar185 + pdVar9[lVar12];
        }
        dVar60 = dVar103 / dVar124;
        dVar120 = dVar120 * dVar121 * 0.024691358024691357 * 1.4422495703074083 * dVar60;
        if (dVar104 < 1.35) {
          dVar120 = (double)(~uVar14 & (ulong)dVar120);
          dVar104 = 1.0 / (dVar68 * dVar68);
          dVar121 = dVar175 * dVar175;
          dVar120 = dVar61 * -2.6666666666666665 *
                    (dVar69 * (-dVar21 * dVar120 * dVar24 +
                              dVar128 * dVar120 +
                              ((dVar121 * -4.0 * dVar105 +
                               (dVar104 / dVar68) * dVar121 * dVar24 * 0.25 +
                               dVar104 * -2.0 * dVar121 * dVar24 + dVar120 * dVar87 * dVar24 * 0.5)
                              - dVar23 * dVar121 * dVar24)) +
                    dVar175 * 4.0 * dVar129 +
                    (dVar120 + dVar120) * dVar70 +
                    -dVar24 * dVar23 * dVar120 +
                    ((dVar87 * dVar24 + dVar87 * dVar24) * dVar121 -
                    (dVar104 / dVar61) * dVar121 * dVar24 * 0.5)) +
                    dVar120 * -2.6666666666666665 * dVar22 + dVar175 * -5.333333333333333 * dVar176;
        }
        else {
          dVar120 = (double)(uVar14 & (ulong)dVar120);
          dVar122 = dVar122 * dVar122;
          auVar100._0_8_ = (double)local_828._8_8_ * dVar122;
          auVar100._8_8_ = auVar98._8_8_ * dVar120;
          auVar117 = divpd(auVar100,_DAT_00f7bbb0);
          local_a8 = auVar198._0_8_;
          dStack_a0 = auVar198._8_8_;
          auVar142._0_8_ = auVar98._0_8_ * dVar120;
          auVar142._8_8_ = local_a8 * dVar122;
          auVar98 = divpd(auVar142,_DAT_00f7bbc0);
          auVar151._0_8_ = dStack_a0 * dVar122;
          auVar151._8_8_ = auVar63._8_8_ * dVar120;
          auVar170 = divpd(auVar151,_DAT_00f7bbd0);
          auVar143._0_8_ = auVar63._0_8_ * dVar120;
          auVar143._8_8_ = dVar183 * dVar122;
          auVar63 = divpd(auVar143,_DAT_00f7bbe0);
          auVar101._0_8_ = dVar211 * dVar122;
          auVar101._8_8_ = auVar182._8_8_ * dVar120;
          auVar198 = divpd(auVar101,_DAT_00f7bbf0);
          auVar144._0_8_ = auVar182._0_8_ * dVar120;
          auVar144._8_8_ = (dVar211 / dVar123) * dVar122;
          auVar182 = divpd(auVar144,_DAT_00f7bc00);
          dVar120 = ((((((((((dVar120 * (1.0 / auVar64._0_8_)) / 240.0 +
                             (dVar199 * dVar122) / -48.0 +
                             ((1.0 / auVar64._8_8_) * dVar120) / -18.0 +
                             ((1.0 / dVar212) * dVar122) / 6.0 + auVar117._0_8_) - auVar117._8_8_) -
                          auVar98._8_8_) + auVar98._0_8_ + auVar170._0_8_) - auVar170._8_8_) -
                       auVar63._8_8_) + auVar63._0_8_ + auVar198._0_8_) - auVar198._8_8_) -
                    auVar182._8_8_) + auVar182._0_8_;
        }
        dVar22 = (dVar213 / dVar190) * 1.5874010519681996;
        dVar61 = 1.0 / (dVar124 * dVar191);
        dVar21 = (dVar103 / (dVar147 * dVar190)) * 1.2599210498948732;
        dVar87 = dVar213 / (dVar190 * dVar191);
        dVar121 = (dVar103 / dVar191) / (dVar147 * dVar190);
        dVar122 = dVar171 * dVar154;
        dVar191 = dVar191 * dVar191;
        dVar103 = 1.0 / (dVar124 * dVar191);
        dVar184 = dVar229 / dVar184;
        dVar104 = 0.0;
        if (bVar11 && bVar10) {
          dVar233 = dVar233 * dVar61;
          dVar104 = dVar229 * dVar87 * 1.5874010519681996;
          dVar23 = dVar26 * dVar121 * 1.2599210498948732;
          dVar104 = (dVar23 * dVar51 * -2.1845333333333334e-09 +
                     dVar104 * dVar155 * 1.274311111111111e-07 +
                     dVar50 * dVar4 * 6.990506666666666e-10 * dVar23 +
                     dVar49 * -1.6110933333333333e-07 * dVar104 +
                     dVar233 * dVar153 * 1.8432e-05 +
                     dVar154 * dVar3 * 4.369066666666667e-08 * dVar104 +
                     dVar230 * -1.956977777777778e-05 * dVar233 +
                     dVar21 * dVar27 * dVar200 * 0.0010808888888888888 +
                     dVar201 * dVar2 * 3.6408888888888887e-06 * dVar233 +
                     dVar152 * 0.03911111111111111 * dVar22 * dVar204 +
                     dVar234 * -0.000768 * dVar21 * dVar27 +
                    dVar103 * dVar184 * dVar122 * dVar5 * 9.320675555555556e-12) * dVar163 * dVar30
                    + dVar67 * -0.09375 * dVar19 * dVar62 * dVar111 * dVar224 +
                      dVar156 * dVar120 * dVar30 +
                      (((dVar62 * (dVar213 / dVar66) * dVar67 * dVar29) / 96.0 -
                       dVar156 * dVar224 * dVar67 * dVar52 * 0.03125) -
                      dVar67 * dVar52 * dVar132 * 0.03125);
        }
        dVar69 = dVar60 * 1.2599210498948732;
        dVar62 = dVar17 * 0.0014764770444444443 * dVar69 * dVar37 * dVar181;
        dVar19 = dVar58 * 0.035616666666666665 * (1.0 / dVar88) * dVar113 * dVar90 * dVar134;
        dVar120 = (1.0 / (dVar78 * dVar88)) * dVar33;
        dVar23 = (dVar120 + dVar120) * dVar134 * dVar90 * dVar90;
        dVar24 = dVar77 * 1.5874010519681996 * dVar223;
        dVar68 = ((1.0 / dVar18) / dVar158) * 2.080083823051904 * dVar20 * dVar24;
        dVar120 = dVar60 * 2.519842099789747;
        dVar133 = dVar133 * dVar113 * dVar120;
        dVar18 = dVar181 * dVar69 * dVar17;
        if (dVar158 < 0.0) {
          dVar158 = sqrt(dVar158);
        }
        else {
          dVar158 = SQRT(dVar158);
        }
        dVar24 = dVar24 * (1.0 / dVar158) * 2.080083823051904 * dVar20;
        dVar135 = dVar113 * dVar120 * dVar135;
        dVar77 = dVar77 * dVar34 * dVar223;
        dVar134 = dVar134 * dVar53 * (dVar77 * 0.1369277777777778 +
                                     dVar135 * 0.13651666666666668 +
                                     dVar24 * 0.06825833333333334 +
                                     dVar18 * 0.3986222222222222 +
                                     dVar68 * -0.4219833333333333 + dVar133 * 0.8439666666666666);
        dVar105 = dVar33 * (1.0 / (dVar88 * dVar88)) * 16.081824322151103 *
                  (1.0 / (__x * __x)) * dVar90 * dVar90;
        dVar183 = 1.0 / (dVar80 * dVar57);
        dVar199 = dVar77 * 0.137975 +
                  dVar135 * 0.073355 +
                  dVar24 * 0.0366775 +
                  dVar18 * 0.4025666666666667 +
                  dVar68 * -0.5753888888888888 + dVar133 * 1.1507777777777777;
        dVar211 = 1.0 / (dVar57 * dVar57);
        dVar123 = 1.0 / (dVar76 * dVar76);
        dVar235 = dVar235 * dVar235;
        dVar70 = 0.0;
        if (bVar11 && bVar10) {
          dVar70 = dVar32 * (dVar196 * -17.315755899375862 * dVar211 * dVar235 * dVar123 +
                            dVar196 * -0.5848223397455204 * dVar114 * dVar199 * dVar217 +
                            dVar196 * 1.169644679491041 * dVar183 * dVar235 * dVar217 +
                            dVar181 * dVar167 * dVar17 * dVar38 * 0.010843580882781523 * dVar205 +
                            dVar16 * dVar38 * 0.0002441540671567088 * dVar120 * dVar36 * dVar113 +
                            (dVar41 * dVar211 * 17.315755899375862 * dVar123 * dVar235 +
                            dVar41 * dVar114 * 0.5848223397455204 * dVar217 * dVar199 +
                            dVar41 * dVar183 * -1.169644679491041 * dVar217 * dVar235 +
                            dVar58 * -0.010843580882781523 * dVar113 * dVar205 +
                            dVar17 * -0.0002441540671567088 * dVar69 * dVar181 * dVar36 +
                            ((((1.0 / (dVar54 * dVar54)) * dVar39 * 32.1646831778707 *
                               dVar91 * dVar91 * (1.0 / (__x_00 * __x_00)) +
                               dVar55 * (dVar77 * 0.17365833333333333 +
                                        dVar135 * 0.2805166666666667 +
                                        dVar24 * 0.14025833333333335 +
                                        dVar18 * 0.6886333333333333 +
                                        dVar68 * -0.7843833333333333 + dVar133 * 1.5687666666666666)
                               * dVar56 +
                               (1.0 / (dVar79 * dVar54)) * dVar39 * -2.0 * dVar56 * dVar91 * dVar91
                               + dVar17 * -0.0007098192444444445 * dVar69 * dVar40 * dVar181 +
                                 dVar58 * -0.03424666666666667 *
                                 (1.0 / dVar54) * dVar113 * dVar91 * dVar56 + dVar62 + dVar19 +
                              dVar23) - dVar134) - dVar105)) * dVar38 +
                            ((-dVar62 - dVar19) - dVar23) + dVar134 + dVar105) * 0.5;
        }
        dVar62 = dVar187 * dVar121 * 1.2599210498948732;
        dVar25 = dVar20 * 1.5874010519681996 * dVar25;
        dVar181 = ((1.0 / local_b30) / dVar157) * 2.080083823051904 * dVar25;
        dVar94 = dVar94 * dVar15 * dVar60;
        if (dVar157 < 0.0) {
          dVar157 = sqrt(dVar157);
        }
        else {
          dVar157 = SQRT(dVar157);
        }
        dVar83 = dVar165 / dVar83;
        dVar25 = dVar25 * (1.0 / dVar157) * 2.080083823051904;
        dVar23 = dVar15 * dVar60 * dVar95 * 1.4422495703074083;
        dVar223 = dVar20 * 2.080083823051904 * dVar223;
        dVar19 = dVar87 * dVar193 * 1.5874010519681996;
        dVar18 = dVar121 * dVar127 * 1.2599210498948732;
        dVar193 = dVar193 / dVar174;
        pdVar9 = out->v2rho2;
        if ((pdVar9 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          dVar160 = dVar160 * dVar61;
          dVar20 = dVar87 * dVar165 * 1.5874010519681996;
          dVar86 = dVar86 * dVar61;
          dVar62 = (dVar136 * -0.6826666666666666 * dVar62 +
                    dVar82 * 0.7964444444444444 * dVar20 +
                    dVar50 * dVar7 * 0.21845333333333333 * dVar62 +
                    dVar115 * -1.0069333333333332 * dVar20 +
                    dVar145 * 2.304 * dVar160 +
                    dVar154 * dVar6 * 0.2730666666666667 * dVar20 +
                    dVar206 * -2.446222222222222 * dVar160 +
                    dVar159 * 2.7022222222222223 * dVar21 * dVar42 +
                    dVar201 * dVar81 * 0.45511111111111113 * dVar160 +
                    dVar164 * 1.9555555555555555 * dVar22 * dVar172 +
                    dVar92 * -1.92 * dVar21 * dVar42 +
                   dVar122 * dVar8 * 0.14563555555555555 * dVar103 * dVar83) * local_6e8;
          dVar194 = dVar194 * dVar227;
          lVar12 = (long)(p->dim).v2rho2 * sVar13;
          pdVar9[lVar12] =
               (dVar194 + dVar194 +
                dVar62 + dVar62 +
                dVar137 * local_8f0 * 4.0 + dVar104 + dVar104 + dVar125 * dVar70 + dVar125 * dVar70
                + dVar109 * ((dVar126 * -0.5848223397455204 *
                              (1.0 / dVar59) *
                              (dVar223 * 0.137975 +
                              dVar23 * 0.073355 +
                              dVar25 * 0.0366775 +
                              dVar16 * dVar120 * 0.4025666666666667 +
                              dVar181 * -0.5753888888888888 + dVar94 * 1.1507777777777777) * dVar225
                              + dVar89 * dVar106 * dVar16 * 0.010843580882781523 * dVar231 +
                                dVar60 * dVar15 * dVar106 * 1.4422495703074083 *
                                                  0.0002441540671567088 * dVar47 +
                                dVar207 * (dVar223 * 0.1369277777777778 +
                                          dVar23 * 0.13651666666666668 +
                                          dVar25 * 0.06825833333333334 +
                                          dVar16 * dVar120 * 0.3986222222222222 +
                                          dVar181 * -0.4219833333333333 +
                                          dVar94 * 0.8439666666666666) * dVar237 +
                                dVar16 * -0.0014764770444444443 * dVar120 * dVar46 +
                                dVar17 * -0.035616666666666665 * dVar110 * (1.0 / dVar93) *
                                dVar237 * dVar96 +
                                (1.0 / (dVar85 * dVar93)) * dVar45 * -2.0 *
                                dVar237 * dVar96 * dVar96 +
                                dVar45 * (1.0 / (dVar93 * dVar93)) * 16.081824322151103 *
                                (1.0 / (__x_01 * __x_01)) * dVar96 * dVar96 +
                                dVar126 * 1.169644679491041 *
                                (1.0 / (dVar107 * dVar59)) * dVar226 * dVar226 * dVar225 +
                             dVar126 * -17.315755899375862 *
                             (1.0 / (__x_02 * __x_02)) *
                             (1.0 / (dVar59 * dVar59)) * dVar226 * dVar226) - (dVar70 + dVar70)) +
               (dVar138 * -1.65888e-08 * dVar18 +
                dVar108 * 6.4512e-07 * dVar19 +
                dVar50 * dVar71 * 5.308416e-09 * dVar18 +
                dVar208 * -8.15616e-07 * dVar19 +
                dVar161 * 6.2208e-05 * dVar86 +
                dVar154 * dVar35 * 2.21184e-07 * dVar19 +
                dVar220 * -6.6048e-05 * dVar86 +
                dVar166 * 0.002432 * dVar21 * dVar48 +
                dVar201 * dVar102 * 1.2288e-05 * dVar86 +
                dVar188 * 0.058666666666666666 * dVar22 * dVar214 +
                dVar238 * -0.001728 * dVar21 * dVar48 +
               dVar122 * dVar192 * 1.0616832e-10 * dVar103 * dVar193) * dVar146) * dVar66 +
               dVar203 + dVar203 + dVar219 + dVar219 + dVar209 * 4.0 + dVar112 * 4.0 + dVar221 * 4.0
               + pdVar9[lVar12];
        }
        dVar181 = 1.0 / (dVar66 * dVar191);
        dVar62 = 0.0;
        if (bVar11 && bVar10) {
          dVar62 = (dVar155 * 7.86432e-10 * dVar216 +
                    dVar139 * -4.369066666666667e-08 * dVar195 +
                    dVar49 * -2.62144e-10 * dVar216 +
                    dVar153 * 5.7344e-08 * dVar195 +
                    dVar169 * -6.144e-06 * dVar131 +
                    dVar230 * -1.6384e-08 * dVar195 +
                    dVar200 * 6.826666666666667e-06 * dVar131 +
                    dVar116 * -0.00034133333333333335 * dVar179 +
                    dVar234 * -1.3653333333333333e-06 * dVar131 +
                    dVar2 * 1.5874010519681996 * -0.010666666666666666 * dVar202 * dVar204 +
                    dVar177 * dVar27 * dVar2 * 1.2599210498948732 * 0.000256 * dVar1 +
                   dVar181 * dVar184 * dVar51 * -3.4952533333333333e-12) * dVar163 * dVar30 +
                   dVar31 * dVar224 * dVar30 + dVar52 * dVar67 * dVar97 * -0.015625;
        }
        pdVar9 = out->v2rhosigma;
        if ((pdVar9 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          dVar150 = dVar150 * local_8f0;
          local_6e8 = local_6e8 *
                      (dVar82 * 0.24576 * dVar197 +
                       dVar162 * -0.2730666666666667 * dVar180 +
                       dVar115 * -0.08192 * dVar197 +
                       dVar145 * 0.3584 * dVar180 +
                       dVar239 * -0.768 * dVar218 +
                       dVar206 * -0.1024 * dVar180 +
                       dVar159 * 0.8533333333333334 * dVar218 +
                       dVar149 * -0.8533333333333334 * dVar236 +
                       dVar92 * -0.17066666666666666 * dVar218 +
                       dVar81 * 1.5874010519681996 * -0.5333333333333333 * dVar202 * dVar172 +
                       dVar177 * dVar42 * dVar81 * 1.2599210498948732 * 0.64 * dVar1 +
                      dVar136 * -0.05461333333333333 * dVar181 * dVar83);
          lVar12 = (long)(p->dim).v2rhosigma * sVar13;
          pdVar9[lVar12] =
               (local_6e8 + local_6e8 + dVar62 + dVar62 + dVar150 + dVar150 + dVar73 * dVar227 +
               (dVar108 * 5.971968e-09 * dVar215 +
                dVar210 * -2.21184e-07 * dVar168 +
                dVar208 * -1.990656e-09 * dVar215 +
                dVar161 * 2.90304e-07 * dVar168 +
                dVar232 * -2.0736e-05 * dVar130 +
                dVar220 * -8.2944e-08 * dVar168 +
                dVar166 * 2.304e-05 * dVar130 +
                dVar173 * -0.000768 * dVar178 +
                dVar238 * -4.608e-06 * dVar130 +
                dVar102 * 1.5874010519681996 * -0.016 * dVar202 * dVar214 +
                dVar177 * dVar48 * dVar102 * 1.2599210498948732 * 0.000576 * dVar1 +
               dVar138 * -3.981312e-11 * dVar181 * dVar193) * dVar146) * dVar66 + dVar185 +
               pdVar9[lVar12];
        }
        dVar191 = 1.0 / dVar191;
        dVar62 = 0.0;
        if (bVar11 && bVar10) {
          dVar30 = dVar30 * dVar163 * (dVar139 * -2.62144e-10 * dVar148 +
                                       dVar5 * dVar171 * 1.2288e-08 * dVar75 +
                                       dVar153 * 9.8304e-11 * dVar148 +
                                       dVar169 * -1.8432e-08 * dVar75 +
                                       dVar4 * dVar1 * 1.536e-06 * dVar186 +
                                       dVar200 * 6.144e-09 * dVar75 +
                                       dVar116 * -2.048e-06 * dVar186 +
                                       dVar27 * dVar72 * dVar3 * 1.2599210498948732 * 6.4e-05 +
                                       dVar2 * 1.2599210498948732 * -6.4e-05 * dVar27 * dVar72 +
                                       dVar152 * 5.12e-07 * dVar186 +
                                      dVar184 * dVar191 * dVar155 * 1.31072e-12);
          dVar62 = dVar30 + dVar30;
        }
        pdVar9 = out->v2sigma2;
        if ((pdVar9 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
          lVar12 = (long)(p->dim).v2sigma2 * sVar13;
          pdVar9[lVar12] =
               dVar66 * (dVar146 * (dVar210 * -1.990656e-09 * dVar228 +
                                    dVar192 * dVar171 * 6.2208e-08 * dVar74 +
                                    dVar161 * 7.46496e-10 * dVar228 +
                                    dVar232 * -9.3312e-08 * dVar74 +
                                    dVar71 * dVar1 * 5.184e-06 * dVar28 +
                                    dVar166 * 3.1104e-08 * dVar74 +
                                    dVar173 * -6.912e-06 * dVar28 +
                                    dVar35 * 1.2599210498948732 * 0.000144 * dVar48 * dVar72 +
                                    dVar102 * 1.2599210498948732 * -0.000144 * dVar48 * dVar72 +
                                    dVar188 * 1.728e-06 * dVar28 +
                                   dVar108 * 1.492992e-11 * dVar193 * dVar191) +
                        dVar44 * (dVar162 * -0.08192 * dVar222 +
                                  dVar8 * dVar171 * 0.0768 * dVar43 +
                                  dVar145 * 0.03072 * dVar222 +
                                  dVar239 * -0.1152 * dVar43 +
                                  dVar7 * dVar1 * 0.192 * dVar84 +
                                  dVar159 * 0.0384 * dVar43 +
                                  dVar149 * -0.256 * dVar84 +
                                  dVar6 * 1.2599210498948732 * 0.16 * dVar42 * dVar72 +
                                  dVar81 * 1.2599210498948732 * -0.16 * dVar42 * dVar72 +
                                  dVar164 * 0.064 * dVar84 + dVar82 * 0.02048 * dVar83 * dVar191) +
                        dVar62) + pdVar9[lVar12];
        }
      }
      sVar13 = sVar13 + 1;
    } while (np != sVar13);
  }
  return;
}

Assistant:

static void
WORK_GGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, const double *sigma,
         xc_gga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};
  double my_sigma[3] = {0.0, 0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));
    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, out);
    
    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 %le 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(sigma, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le %le %le %le 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1),
                 VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2));
        }
      }
    }
#endif
  }   /* for(ip) */

}